

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

int xmlSchemaExpandAttributeGroupRefs
              (xmlSchemaParserCtxtPtr pctxt,xmlSchemaBasicItemPtr item,
              xmlSchemaWildcardPtr *completeWild,xmlSchemaItemListPtr list,
              xmlSchemaItemListPtr prohibs)

{
  int *item_00;
  xmlSchemaPtr schema;
  xmlSchemaWildcardNsPtr pxVar1;
  xmlChar *pxVar2;
  long *plVar3;
  void *pvVar4;
  int iVar5;
  xmlNodePtr pxVar6;
  xmlSchemaWildcardPtr dest;
  xmlSchemaWildcardNsPtr pxVar7;
  xmlSchemaWildcardNsPtr pxVar8;
  void **ppvVar9;
  xmlChar *pxVar10;
  _xmlSchemaWildcardNs *p_Var11;
  xmlSchemaWildcardNsPtr *ppxVar12;
  long lVar13;
  xmlSchemaWildcardPtr source;
  xmlSchemaWildcardNsPtr pxVar14;
  xmlSchemaAttributeGroupPtr_conflict attrGr;
  xmlSchemaWildcardNsPtr pxVar15;
  xmlSchemaItemListPtr str2;
  long lVar16;
  xmlSchemaWildcardNsPtr *ppxVar17;
  long lVar18;
  int idx;
  bool bVar19;
  xmlSchemaAttributeGroupPtr_conflict in_stack_ffffffffffffff90;
  xmlChar *local_48;
  xmlSchemaWildcardNsPtr local_40;
  xmlSchemaBasicItemPtr local_38;
  
  bVar19 = *completeWild != (xmlSchemaWildcardPtr)0x0;
  if (prohibs != (xmlSchemaItemListPtr)0x0) {
    prohibs->nbItems = 0;
  }
  iVar5 = list->nbItems;
  local_38 = item;
  if (0 < iVar5) {
    idx = 0;
    str2 = prohibs;
    do {
      lVar18 = (long)idx;
      item_00 = (int *)list->items[lVar18];
      if (*item_00 == 2000) {
        if (item_00[4] == 0x10) {
          attrGr = *(xmlSchemaAttributeGroupPtr_conflict *)(item_00 + 2);
          if (attrGr == (xmlSchemaAttributeGroupPtr_conflict)0x0) {
            return -1;
          }
          if (((attrGr->flags & 1) == 0) &&
             (iVar5 = xmlSchemaAttributeGroupExpandRefs(pctxt,attrGr), iVar5 == -1)) {
            return -1;
          }
          source = attrGr->attributeWildcard;
          if (source != (xmlSchemaWildcardPtr)0x0) {
            dest = *completeWild;
            if (dest == (xmlSchemaWildcardPtr)0x0) {
              *completeWild = source;
            }
            else {
              if (!bVar19) {
                schema = pctxt->schema;
                pxVar6 = xmlSchemaGetComponentNode(local_38);
                dest = xmlSchemaAddWildcard(pctxt,schema,XML_SCHEMA_TYPE_ANY_ATTRIBUTE,pxVar6);
                if (dest == (xmlSchemaWildcardPtr)0x0) {
                  return -1;
                }
                iVar5 = xmlSchemaCloneWildcardNsConstraints(pctxt,dest,*completeWild);
                if (iVar5 == -1) {
                  return -1;
                }
                dest->processContents = (*completeWild)->processContents;
                *completeWild = dest;
                source = attrGr->attributeWildcard;
              }
              iVar5 = dest->any;
              if (iVar5 == source->any) {
                pxVar7 = dest->nsSet;
                if ((pxVar7 == (xmlSchemaWildcardNsPtr)0x0) ==
                    (source->nsSet != (xmlSchemaWildcardNsPtr)0x0)) {
LAB_001bde2b:
                  pxVar7 = dest->negNsSet;
                  if ((pxVar7 == (xmlSchemaWildcardNsPtr)0x0) ||
                     (source->nsSet == (xmlSchemaWildcardNsPtr)0x0)) {
                    str2 = (xmlSchemaItemListPtr)source->negNsSet;
                    p_Var11 = dest->nsSet;
                    if (str2 == (xmlSchemaItemListPtr)0x0) {
                      if ((p_Var11 != (_xmlSchemaWildcardNs *)0x0) &&
                         (source->nsSet != (xmlSchemaWildcardNsPtr)0x0)) {
                        local_40 = (xmlSchemaWildcardNsPtr)&source->nsSet;
                        pxVar15 = (xmlSchemaWildcardNsPtr)0x0;
                        pxVar7 = local_40;
                        do {
                          bVar19 = pxVar15 == (xmlSchemaWildcardNsPtr)0x0;
                          pxVar8 = pxVar15;
                          pxVar15 = p_Var11;
                          pxVar14 = pxVar7;
                          if (bVar19) {
                            pxVar8 = (xmlSchemaWildcardNsPtr)&dest->nsSet;
                          }
                          do {
                            while (pxVar7 = pxVar7->next, pxVar7 == (xmlSchemaWildcardNsPtr)0x0) {
                              pxVar1 = pxVar15->next;
                              pxVar8->next = pxVar1;
                              (*xmlFree)(pxVar15);
                              pxVar7 = local_40;
                              pxVar15 = pxVar1;
                              pxVar14 = local_40;
                              if (pxVar1 == (xmlSchemaWildcardNsPtr)0x0) goto LAB_001bdffa;
                            }
                          } while (pxVar15->value != pxVar7->value);
                          p_Var11 = pxVar15->next;
                          pxVar7 = pxVar14;
                        } while (p_Var11 != (_xmlSchemaWildcardNs *)0x0);
                      }
                    }
                    else {
                      if (p_Var11 != (_xmlSchemaWildcardNs *)0x0) goto LAB_001bde6a;
                      if (pxVar7 != (xmlSchemaWildcardNsPtr)0x0) {
                        pxVar10 = pxVar7->value;
                        pxVar2 = *(xmlChar **)&str2->nbItems;
                        if (((pxVar10 == (xmlChar *)0x0) || (pxVar10 == pxVar2)) ||
                           (pxVar2 == (xmlChar *)0x0)) {
                          if ((pxVar10 == (xmlChar *)0x0) && (pxVar2 != (xmlChar *)0x0)) {
                            pxVar7->value = pxVar2;
                          }
                        }
                        else {
                          str2 = (xmlSchemaItemListPtr)0x0;
                          xmlSchemaPErr(pctxt,dest->node,0x701,
                                        "The intersection of the wildcard is not expressible.\n",
                                        (xmlChar *)0x0,(xmlChar *)0x0);
                        }
                      }
                    }
                  }
                  else {
                    if (dest->nsSet == (xmlSchemaWildcardNsPtr)0x0) {
                      pxVar10 = pxVar7->value;
                      iVar5 = xmlSchemaCloneWildcardNsConstraints(pctxt,dest,source);
                      if (iVar5 == -1) {
                        return -1;
                      }
                    }
                    else {
                      str2 = (xmlSchemaItemListPtr)source->negNsSet;
LAB_001bde6a:
                      pxVar10 = *(xmlChar **)&str2->nbItems;
                    }
                    ppxVar17 = &dest->nsSet;
                    pxVar15 = (xmlSchemaWildcardNsPtr)0x0;
                    pxVar7 = (xmlSchemaWildcardNsPtr)ppxVar17;
                    do {
                      pxVar8 = pxVar15;
                      pxVar7 = pxVar7->next;
                      if (pxVar7 == (xmlSchemaWildcardNsPtr)0x0) goto LAB_001bdf54;
                      pxVar15 = pxVar7;
                    } while (pxVar7->value != (xmlChar *)0x0);
                    if (pxVar8 == (xmlSchemaWildcardNsPtr)0x0) {
                      pxVar8 = (xmlSchemaWildcardNsPtr)ppxVar17;
                    }
                    pxVar8->next = pxVar7->next;
                    (*xmlFree)(pxVar7);
LAB_001bdf54:
                    if (pxVar10 != (xmlChar *)0x0) {
                      pxVar15 = (xmlSchemaWildcardNsPtr)(xmlSchemaWildcardNsPtr *)0x0;
                      pxVar7 = (xmlSchemaWildcardNsPtr)ppxVar17;
                      do {
                        ppxVar12 = &pxVar15->next;
                        pxVar7 = pxVar7->next;
                        if (pxVar7 == (xmlSchemaWildcardNsPtr)0x0) goto LAB_001bdffa;
                        pxVar15 = pxVar7;
                      } while (pxVar7->value != pxVar10);
                      if (ppxVar12 != (xmlSchemaWildcardNsPtr *)0x0) {
                        ppxVar17 = ppxVar12;
                      }
                      *ppxVar17 = pxVar7->next;
                      (*xmlFree)(pxVar7);
                    }
                  }
                }
                else {
                  pxVar15 = dest->negNsSet;
                  str2 = (xmlSchemaItemListPtr)
                         CONCAT71((int7)((ulong)str2 >> 8),pxVar15 == (xmlSchemaWildcardNsPtr)0x0);
                  if (((pxVar15 == (xmlSchemaWildcardNsPtr)0x0) ==
                       (source->negNsSet != (xmlSchemaWildcardNsPtr)0x0)) ||
                     ((pxVar15 != (xmlSchemaWildcardNsPtr)0x0 &&
                      (pxVar15->value != source->negNsSet->value)))) goto LAB_001bde2b;
                  if (pxVar7 != (xmlSchemaWildcardNsPtr)0x0) {
                    pxVar15 = (xmlSchemaWildcardNsPtr)&source->nsSet;
                    do {
                      pxVar15 = pxVar15->next;
                      if (pxVar15 == (xmlSchemaWildcardNsPtr)0x0) goto LAB_001bddf6;
                      str2 = (xmlSchemaItemListPtr)pxVar7->value;
                    } while ((str2 != (xmlSchemaItemListPtr)pxVar15->value) ||
                            (pxVar7 = pxVar7->next, pxVar15 = (xmlSchemaWildcardNsPtr)&source->nsSet
                            , pxVar7 != (_xmlSchemaWildcardNs *)0x0));
                  }
                }
LAB_001bdffa:
                bVar19 = true;
                in_stack_ffffffffffffff90 = attrGr;
              }
              else {
LAB_001bddf6:
                if ((iVar5 == 0) || (iVar5 == source->any)) goto LAB_001bde2b;
                iVar5 = xmlSchemaCloneWildcardNsConstraints(pctxt,dest,source);
                bVar19 = true;
                in_stack_ffffffffffffff90 = attrGr;
                if (iVar5 == -1) {
                  return -1;
                }
              }
            }
          }
          plVar3 = (long *)attrGr->attrUses;
          if ((plVar3 == (long *)0x0) || (lVar16 = plVar3[1], (int)lVar16 == 0)) {
            iVar5 = xmlSchemaItemListRemove(list,idx);
            if (iVar5 == -1) {
              return -1;
            }
            idx = idx + -1;
          }
          else {
            list->items[lVar18] = *(void **)*plVar3;
            if (1 < (int)lVar16) {
              lVar16 = 1;
              do {
                pvVar4 = *(void **)(*plVar3 + lVar16 * 8);
                ppvVar9 = list->items;
                if (ppvVar9 == (void **)0x0) {
                  ppvVar9 = (void **)(*xmlMalloc)(0xa0);
                  list->items = ppvVar9;
                  if (ppvVar9 == (void **)0x0) {
                    __xmlSimpleError(0x10,2,(xmlNodePtr)0x0,(char *)0x0,"allocating new item list");
                    return -1;
                  }
                  list->sizeItems = 0x14;
                }
                else {
                  iVar5 = list->sizeItems;
                  if (iVar5 <= list->nbItems) {
                    list->sizeItems = iVar5 * 2;
                    ppvVar9 = (void **)(*xmlRealloc)(ppvVar9,(long)iVar5 << 4);
                    list->items = ppvVar9;
                    if (ppvVar9 == (void **)0x0) {
                      __xmlSimpleError(0x10,2,(xmlNodePtr)0x0,(char *)0x0,"growing item list");
                      list->sizeItems = 0;
                      return -1;
                    }
                  }
                }
                lVar18 = lVar18 + 1;
                iVar5 = list->nbItems;
                lVar13 = (long)iVar5;
                if (lVar18 < lVar13) {
                  do {
                    list->items[lVar13] = list->items[lVar13 + -1];
                    lVar13 = lVar13 + -1;
                  } while (lVar18 < lVar13);
                  list->items[lVar18] = pvVar4;
                  list->nbItems = iVar5 + 1;
                }
                else {
                  list->nbItems = iVar5 + 1;
                  ppvVar9[lVar13] = pvVar4;
                }
                lVar16 = lVar16 + 1;
              } while (lVar16 < (int)plVar3[1]);
              idx = (int)lVar18;
            }
          }
        }
      }
      else if (*item_00 == 0x7d1) {
        if (prohibs == (xmlSchemaItemListPtr)0x0) {
          xmlSchemaInternalErr2
                    ((xmlSchemaAbstractCtxtPtr)pctxt,"xmlSchemaExpandAttributeGroupRefs",
                     "unexpected attr prohibition found",(xmlChar *)0x0,(xmlChar *)str2);
          return -1;
        }
        iVar5 = xmlSchemaItemListRemove(list,idx);
        if (iVar5 == -1) {
          return -1;
        }
        idx = idx + -1;
        xmlSchemaItemListAddSize(prohibs,2,item_00);
      }
      idx = idx + 1;
      iVar5 = list->nbItems;
    } while (idx < iVar5);
  }
  if ((prohibs != (xmlSchemaItemListPtr)0x0) &&
     (lVar18 = (long)prohibs->nbItems, iVar5 != 0 && 0 < lVar18)) {
    do {
      if (0 < (long)list->nbItems) {
        pvVar4 = prohibs->items[lVar18 + -1];
        lVar16 = 0;
        do {
          lVar13 = *(long *)((long)list->items[lVar16] + 0x18);
          if ((*(xmlChar **)((long)pvVar4 + 0x10) == *(xmlChar **)(lVar13 + 0x10)) &&
             (*(xmlChar **)((long)pvVar4 + 0x18) == *(xmlChar **)(lVar13 + 0x70))) {
            local_48 = (xmlChar *)0x0;
            pxVar6 = *(xmlNodePtr *)((long)pvVar4 + 8);
            pxVar10 = xmlSchemaFormatQName
                                (&local_48,*(xmlChar **)((long)pvVar4 + 0x18),
                                 *(xmlChar **)((long)pvVar4 + 0x10));
            xmlSchemaCustomWarning
                      ((xmlSchemaAbstractCtxtPtr)pctxt,XML_SCHEMAP_WARN_ATTR_POINTLESS_PROH,pxVar6,
                       (xmlSchemaTypePtr)
                       "Skipping pointless attribute use prohibition \'%s\', since a corresponding attribute use exists already in the type definition"
                       ,(char *)pxVar10,(xmlChar *)0x0,(xmlChar *)0x0,
                       (xmlChar *)in_stack_ffffffffffffff90);
            if (local_48 != (xmlChar *)0x0) {
              (*xmlFree)(local_48);
            }
            iVar5 = xmlSchemaItemListRemove(prohibs,(int)(lVar18 + -1));
            if (iVar5 == -1) {
              return -1;
            }
            break;
          }
          lVar16 = lVar16 + 1;
        } while (list->nbItems != lVar16);
      }
      bVar19 = 1 < lVar18;
      lVar18 = lVar18 + -1;
    } while (bVar19);
  }
  return 0;
}

Assistant:

static int
xmlSchemaExpandAttributeGroupRefs(xmlSchemaParserCtxtPtr pctxt,
				  xmlSchemaBasicItemPtr item,
				  xmlSchemaWildcardPtr *completeWild,
				  xmlSchemaItemListPtr list,
				  xmlSchemaItemListPtr prohibs)
{
    xmlSchemaAttributeGroupPtr gr;
    xmlSchemaAttributeUsePtr use;
    xmlSchemaItemListPtr sublist;
    int i, j;
    int created = (*completeWild == NULL) ? 0 : 1;

    if (prohibs)
	prohibs->nbItems = 0;

    for (i = 0; i < list->nbItems; i++) {
	use = list->items[i];

	if (use->type == XML_SCHEMA_EXTRA_ATTR_USE_PROHIB) {
	    if (prohibs == NULL) {
		PERROR_INT("xmlSchemaExpandAttributeGroupRefs",
		    "unexpected attr prohibition found");
		return(-1);
	    }
	    /*
	    * Remove from attribute uses.
	    */
	    if (xmlSchemaItemListRemove(list, i) == -1)
		return(-1);
	    i--;
	    /*
	    * Note that duplicate prohibitions were already
	    * handled at parsing time.
	    */
	    /*
	    * Add to list of prohibitions.
	    */
	    xmlSchemaItemListAddSize(prohibs, 2, use);
	    continue;
	}
	if ((use->type == XML_SCHEMA_EXTRA_QNAMEREF) &&
	    ((WXS_QNAME_CAST use)->itemType == XML_SCHEMA_TYPE_ATTRIBUTEGROUP))
	{
	    if ((WXS_QNAME_CAST use)->item == NULL)
		return(-1);
	    gr = WXS_ATTR_GROUP_CAST (WXS_QNAME_CAST use)->item;
	    /*
	    * Expand the referenced attr. group.
	    * TODO: remove this, this is done in a previous step, so
	    * already done here.
	    */
	    if ((gr->flags & XML_SCHEMAS_ATTRGROUP_WILDCARD_BUILDED) == 0) {
		if (xmlSchemaAttributeGroupExpandRefs(pctxt, gr) == -1)
		    return(-1);
	    }
	    /*
	    * Build the 'complete' wildcard; i.e. intersect multiple
	    * wildcards.
	    */
	    if (gr->attributeWildcard != NULL) {
		if (*completeWild == NULL) {
		    *completeWild = gr->attributeWildcard;
		} else {
		    if (! created) {
			xmlSchemaWildcardPtr tmpWild;

			 /*
			* Copy the first encountered wildcard as context,
			* except for the annotation.
			*
			* Although the complete wildcard might not correspond
			* to any node in the schema, we will anchor it on
			* the node of the owner component.
			*/
			tmpWild =  xmlSchemaAddWildcard(pctxt, pctxt->schema,
			    XML_SCHEMA_TYPE_ANY_ATTRIBUTE,
			    WXS_ITEM_NODE(item));
			if (tmpWild == NULL)
			    return(-1);
			if (xmlSchemaCloneWildcardNsConstraints(pctxt,
			    tmpWild, *completeWild) == -1)
			    return (-1);
			tmpWild->processContents = (*completeWild)->processContents;
			*completeWild = tmpWild;
			created = 1;
		    }

		    if (xmlSchemaIntersectWildcards(pctxt, *completeWild,
			gr->attributeWildcard) == -1)
			return(-1);
		}
	    }
	    /*
	    * Just remove the reference if the referenced group does not
	    * contain any attribute uses.
	    */
	    sublist = ((xmlSchemaItemListPtr) gr->attrUses);
	    if ((sublist == NULL) || sublist->nbItems == 0) {
		if (xmlSchemaItemListRemove(list, i) == -1)
		    return(-1);
		i--;
		continue;
	    }
	    /*
	    * Add the attribute uses.
	    */
	    list->items[i] = sublist->items[0];
	    if (sublist->nbItems != 1) {
		for (j = 1; j < sublist->nbItems; j++) {
		    i++;
		    if (xmlSchemaItemListInsert(list,
			    sublist->items[j], i) == -1)
			return(-1);
		}
	    }
	}

    }
    /*
    * Handle pointless prohibitions of declared attributes.
    */
    if (prohibs && (prohibs->nbItems != 0) && (list->nbItems != 0)) {
	xmlSchemaAttributeUseProhibPtr prohib;

	for (i = prohibs->nbItems -1; i >= 0; i--) {
	    prohib = prohibs->items[i];
	    for (j = 0; j < list->nbItems; j++) {
		use = list->items[j];

		if ((prohib->name == WXS_ATTRUSE_DECL_NAME(use)) &&
		    (prohib->targetNamespace == WXS_ATTRUSE_DECL_TNS(use)))
		{
		    xmlChar *str = NULL;

		    xmlSchemaCustomWarning(ACTXT_CAST pctxt,
			XML_SCHEMAP_WARN_ATTR_POINTLESS_PROH,
			prohib->node, NULL,
			"Skipping pointless attribute use prohibition "
			"'%s', since a corresponding attribute use "
			"exists already in the type definition",
			xmlSchemaFormatQName(&str,
			    prohib->targetNamespace, prohib->name),
			NULL, NULL);
		    FREE_AND_NULL(str);
		    /*
		    * Remove the prohibition.
		    */
		    if (xmlSchemaItemListRemove(prohibs, i) == -1)
			return(-1);
		    break;
		}
	    }
	}
    }
    return(0);
}